

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit
          (PostResolutionChecks *this,VariableDeclaration *v)

{
  Expression *pEVar1;
  Context context;
  Type type;
  Context CStack_78;
  Type local_60;
  CompileMessage local_48;
  
  ASTVisitor::visit(&this->super_ASTVisitor,v);
  if ((v->declaredType).object == (Expression *)0x0) {
    pEVar1 = pool_ptr<soul::AST::Expression>::operator*(&v->initialValue);
    throwErrorIfNotReadableValue(pEVar1);
  }
  else {
    pEVar1 = pool_ptr<soul::AST::Expression>::operator*(&v->declaredType);
    throwErrorIfNotReadableType(pEVar1);
  }
  AST::VariableDeclaration::getType(&local_60,v);
  if ((v->declaredType).object != (Expression *)0x0) {
    v = (VariableDeclaration *)pool_ptr<soul::AST::Expression>::operator->(&v->declaredType);
  }
  AST::Context::Context(&CStack_78,&(v->super_Statement).super_ASTObject.context);
  if (local_60.primitiveType.type != void_) {
    throwErrorIfMultidimensionalArray(&CStack_78,&local_60);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&CStack_78);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_60.structure);
    return;
  }
  Errors::variableCannotBeVoid<>();
  AST::Context::throwError(&CStack_78,&local_48,false);
}

Assistant:

void visit (AST::VariableDeclaration& v) override
        {
            super::visit (v);

            if (v.declaredType == nullptr)
                throwErrorIfNotReadableValue (*v.initialValue);
            else
                throwErrorIfNotReadableType (*v.declaredType);

            auto type = v.getType();
            auto context = (v.declaredType != nullptr ? v.declaredType->context : v.context);

            if (type.isVoid())
                context.throwError (Errors::variableCannotBeVoid());

            throwErrorIfMultidimensionalArray (context, type);
        }